

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_run_container_inplace_union(array_container_t *src_1,run_container_t *src_2)

{
  rle16_t *prVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  bool bVar5;
  rle16_t rVar6;
  rle16_t rVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  rle16_t rVar12;
  uint uVar13;
  rle16_t rVar14;
  uint uVar15;
  rle16_t rVar16;
  uint uVar17;
  long lVar18;
  
  iVar8 = src_2->n_runs;
  if ((((long)iVar8 != 1) || (src_2->runs->value != 0)) || (src_2->runs->length != 0xffff)) {
    lVar18 = (long)src_1->cardinality + (long)iVar8;
    iVar8 = (int)lVar18 + iVar8;
    if (src_2->capacity < iVar8) {
      run_container_grow(src_2,iVar8,true);
    }
    memmove(src_2->runs + lVar18,src_2->runs,(long)src_2->n_runs << 2);
    prVar4 = src_2->runs;
    prVar1 = prVar4 + lVar18;
    iVar8 = src_2->n_runs;
    src_2->n_runs = 0;
    uVar2 = *src_1->array;
    bVar5 = prVar1->value <= uVar2;
    if (bVar5) {
      rVar7 = *prVar1;
      *prVar4 = rVar7;
      src_2->n_runs = src_2->n_runs + 1;
    }
    else {
      rVar7.length = 0;
      rVar7.value = uVar2;
      prVar4->value = uVar2;
      prVar4->length = 0;
      src_2->n_runs = 1;
    }
    uVar11 = (uint)!bVar5;
    uVar10 = (uint)bVar5;
    uVar9 = (uint)rVar7 >> 0x10;
    while (((int)uVar10 < iVar8 && ((int)uVar11 < src_1->cardinality))) {
      uVar2 = src_1->array[(int)uVar11];
      rVar14.length = 0;
      rVar14.value = uVar2;
      uVar13 = (uint)rVar7 & 0xffff;
      uVar17 = uVar9 & 0xffff;
      if (uVar2 < prVar1[(int)uVar10].value) {
        uVar17 = uVar17 + uVar13 + 1;
        if (uVar17 < uVar2) {
          rVar16.length = 0;
          rVar16.value = uVar2;
          src_2->runs[src_2->n_runs] = rVar16;
          src_2->n_runs = src_2->n_runs + 1;
          uVar9 = 0;
          rVar7 = rVar14;
        }
        else if (uVar17 == uVar2) {
          uVar9 = uVar9 + 1;
          src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar13);
        }
        uVar11 = uVar11 + 1;
      }
      else {
        rVar14 = prVar1[(int)uVar10];
        if (uVar13 + uVar17 + 1 < ((uint)rVar14 & 0xffff)) {
          prVar4 = src_2->runs;
          iVar3 = src_2->n_runs;
          prVar4[iVar3].value = rVar14.value;
          prVar4[iVar3].length = rVar14.length;
          src_2->n_runs = iVar3 + 1;
          rVar7 = rVar14;
          uVar9 = (uint)rVar14 >> 0x10;
        }
        else {
          uVar15 = ((uint)rVar14 & 0xffff) + ((uint)rVar14 >> 0x10);
          if (uVar17 + uVar13 <= uVar15) {
            uVar9 = uVar15 - uVar13;
            src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar13);
          }
        }
        uVar10 = uVar10 + 1;
      }
    }
    if ((int)uVar11 < src_1->cardinality) {
      if ((int)uVar11 < src_1->cardinality) {
        lVar18 = (long)(int)uVar11;
        do {
          uVar2 = src_1->array[lVar18];
          rVar6.length = 0;
          rVar6.value = uVar2;
          uVar10 = (uVar9 & 0xffff) + ((uint)rVar7 & 0xffff) + 1;
          if (uVar10 < uVar2) {
            rVar12.length = 0;
            rVar12.value = uVar2;
            src_2->runs[src_2->n_runs] = rVar12;
            src_2->n_runs = src_2->n_runs + 1;
            uVar9 = 0;
            rVar7 = rVar6;
          }
          else if (uVar10 == uVar2) {
            uVar9 = uVar9 + 1;
            src_2->runs[(long)src_2->n_runs + -1] =
                 (rle16_t)(uVar9 * 0x10000 | (uint)rVar7 & 0xffff);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < src_1->cardinality);
      }
    }
    else if ((int)uVar10 < iVar8) {
      lVar18 = (long)(int)uVar10;
      do {
        rVar14 = prVar1[lVar18];
        uVar10 = (uint)rVar7 & 0xffff;
        if (uVar10 + (uVar9 & 0xffff) + 1 < ((uint)rVar14 & 0xffff)) {
          prVar4 = src_2->runs;
          iVar3 = src_2->n_runs;
          prVar4[iVar3].value = rVar14.value;
          prVar4[iVar3].length = rVar14.length;
          src_2->n_runs = iVar3 + 1;
          rVar7 = rVar14;
          uVar9 = (uint)rVar14 >> 0x10;
        }
        else {
          uVar11 = ((uint)rVar14 & 0xffff) + ((uint)rVar14 >> 0x10);
          if ((uVar9 & 0xffff) + uVar10 <= uVar11) {
            uVar9 = uVar11 - uVar10;
            src_2->runs[(long)src_2->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar10);
          }
        }
        lVar18 = lVar18 + 1;
      } while (iVar8 != lVar18);
    }
  }
  return;
}

Assistant:

void array_run_container_inplace_union(const array_container_t *src_1,
                                       run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return;
    }
    const int32_t maxoutput = src_1->cardinality + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_2->n_runs;
    if (src_2->capacity < neededcapacity)
        run_container_grow(src_2, neededcapacity, true);
    memmove(src_2->runs + maxoutput, src_2->runs,
            src_2->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc2 = src_2->runs + maxoutput;
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    int src2nruns = src_2->n_runs;
    src_2->n_runs = 0;

    rle16_t previousrle;

    if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(src_2, inputsrc2[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(src_2, src_1->array[arraypos]);
        arraypos++;
    }

    while ((rlepos < src2nruns) && (arraypos < src_1->cardinality)) {
        if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src2nruns) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        }
    }
}